

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintClasses_old(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *pGVar3;
  int i;
  int level;
  
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    return;
  }
  i = 0;
  pGVar3 = p;
  while( true ) {
    level = (int)pGVar3;
    if (p->nRegs <= i) break;
    pGVar3 = p;
    pGVar2 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + i);
    level = (int)pGVar3;
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    pGVar3 = (Gia_Man_t *)p->vFlopClasses;
    uVar1 = Vec_IntEntry((Vec_Int_t *)pGVar3,i);
    Abc_Print((int)pGVar3,"%d",(ulong)uVar1);
    i = i + 1;
  }
  Abc_Print(level,"\n");
  pGVar3 = Gia_ManDupFlopClass(p,1);
  Gia_AigerWrite(pGVar3,"dom1.aig",0,0,0);
  Gia_ManStop(pGVar3);
  pGVar3 = Gia_ManDupFlopClass(p,2);
  Gia_AigerWrite(pGVar3,"dom2.aig",0,0,0);
  Gia_ManStop(pGVar3);
  return;
}

Assistant:

void Gia_ManPrintClasses_old( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->vFlopClasses == NULL )
        return;
    Gia_ManForEachRo( p, pObj, i )
        Abc_Print( 1, "%d", Vec_IntEntry(p->vFlopClasses, i) );
    Abc_Print( 1, "\n" );

    {
        Gia_Man_t * pTemp;
        pTemp = Gia_ManDupFlopClass( p, 1 );
        Gia_AigerWrite( pTemp, "dom1.aig", 0, 0, 0 );
        Gia_ManStop( pTemp );
        pTemp = Gia_ManDupFlopClass( p, 2 );
        Gia_AigerWrite( pTemp, "dom2.aig", 0, 0, 0 );
        Gia_ManStop( pTemp );
    }
}